

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::writeWithFds
          (BlockedPumpTo *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  size_t sVar1;
  size_t size;
  Array<const_kj::ArrayPtr<const_unsigned_char>_> local_a0;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_88;
  undefined1 local_68 [8];
  ArrayBuilder<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  BlockedPumpTo *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_local;
  ArrayPtr<const_unsigned_char> data_local;
  
  moreData_local.size_ = data.size_;
  this_local = (BlockedPumpTo *)moreData.size_;
  sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  if (sVar1 == 0) {
    pieces.disposer = (ArrayDisposer *)moreData_local.size_;
    write(this,(int)data.ptr,(void *)moreData_local.size_,(size_t)moreData.ptr);
  }
  else {
    sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    heapArrayBuilder<kj::ArrayPtr<unsigned_char_const>const>
              ((ArrayBuilder<const_kj::ArrayPtr<const_unsigned_char>_> *)local_68,(kj *)(sVar1 + 1),
               size);
    ArrayBuilder<kj::ArrayPtr<unsigned_char_const>const>::add<kj::ArrayPtr<unsigned_char_const>&>
              ((ArrayBuilder<kj::ArrayPtr<unsigned_char_const>const> *)local_68,
               (ArrayPtr<const_unsigned_char> *)&moreData_local.size_);
    ArrayBuilder<kj::ArrayPtr<unsigned_char_const>const>::
    addAll<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>&>
              ((ArrayBuilder<kj::ArrayPtr<unsigned_char_const>const> *)local_68,
               (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    ArrayBuilder<const_kj::ArrayPtr<const_unsigned_char>_>::finish
              (&local_a0,(ArrayBuilder<const_kj::ArrayPtr<const_unsigned_char>_> *)local_68);
    local_88 = kj::Array::operator_cast_to_ArrayPtr((Array *)&local_a0);
    write(this,(int)data.ptr,local_88.ptr,local_88.size_);
    Array<const_kj::ArrayPtr<const_unsigned_char>_>::~Array(&local_a0);
    ArrayBuilder<const_kj::ArrayPtr<const_unsigned_char>_>::~ArrayBuilder
              ((ArrayBuilder<const_kj::ArrayPtr<const_unsigned_char>_> *)local_68);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeWithFds(ArrayPtr<const byte> data,
                               ArrayPtr<const ArrayPtr<const byte>> moreData,
                               ArrayPtr<const int> fds) override {
      // Pumps drop all capabilities, so fall back to regular write().

      // TODO(cleaunp): After stream API refactor, regular write() methods will take
      //   (data, moreData) and we can clean this up.
      if (moreData.size() == 0) {
        return write(data);
      } else {
        auto pieces = kj::heapArrayBuilder<const ArrayPtr<const byte>>(moreData.size() + 1);
        pieces.add(data);
        pieces.addAll(moreData);
        return write(pieces.finish());
      }
    }